

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV3MapBlock(Parser *this,Texture *map)

{
  string *out;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Logger *pLVar7;
  byte *pbVar8;
  long lVar9;
  Texture *fOut;
  byte *pbVar10;
  string temp;
  string local_218;
  Texture *local_1f8;
  Texture *local_1f0;
  Texture *local_1e8;
  Texture *local_1e0;
  Texture *local_1d8;
  Texture *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  out = &map->mMapName;
  local_1d0 = (Texture *)&map->mOffsetU;
  local_1d8 = (Texture *)&map->mOffsetV;
  local_1e0 = (Texture *)&map->mScaleU;
  local_1e8 = (Texture *)&map->mScaleV;
  local_1f0 = (Texture *)&map->mRotation;
  bVar3 = true;
  iVar5 = 0;
  local_1f8 = map;
LAB_00393128:
  do {
    while( true ) {
      pbVar10 = (byte *)this->filePtr;
      bVar2 = *pbVar10;
      if (bVar2 == 0x2a) break;
LAB_00393461:
      uVar6 = (uint)bVar2;
      bVar1 = false;
      if (uVar6 < 0x7b) {
        if ((uVar6 - 0xc < 2) || (uVar6 == 10)) {
          if (this->bLastWasEndLine != false) goto LAB_0039353e;
          this->iLineNumber = this->iLineNumber + 1;
          bVar1 = true;
        }
        else if (bVar2 == 0) {
          LogError(this,"Encountered unexpected EOL while parsing a *MAP_XXXXXX chunk (Level 3)");
        }
      }
      else {
        if (uVar6 == 0x7d) {
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) {
            this->filePtr = (char *)(pbVar10 + 1);
            SkipToNextToken(this);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,
                              CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                       local_218.field_2._M_local_buf[0]) + 1);
            }
            return;
          }
        }
        else {
          if (uVar6 != 0x7b) goto LAB_00393540;
          iVar5 = iVar5 + 1;
        }
LAB_0039353e:
        bVar1 = false;
      }
LAB_00393540:
      this->bLastWasEndLine = bVar1;
      this->filePtr = (char *)(pbVar10 + 1);
    }
    pbVar8 = pbVar10 + 1;
    this->filePtr = (char *)pbVar8;
    iVar4 = strncmp("MAP_CLASS",(char *)pbVar8,9);
    if (iVar4 == 0) {
      bVar2 = pbVar10[10];
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        pbVar8 = pbVar10 + 0xb;
        if (bVar2 == 0) {
          pbVar8 = pbVar10 + 10;
        }
        this->filePtr = (char *)pbVar8;
        local_218._M_string_length = 0;
        *local_218._M_dataplus._M_p = '\0';
        bVar1 = ParseString(this,&local_218,"*MAP_CLASS");
        if (!bVar1) {
          SkipToNextToken(this);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_218);
        if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_218), iVar4 != 0))
        {
          pLVar7 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[33]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,(char (*) [33])"ASE: Skipping unknown map type: ");
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar7,(char *)local_1c8);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar3 = false;
        }
        goto LAB_00393128;
      }
    }
    if ((bVar3) && (iVar4 = strncmp("BITMAP",(char *)pbVar8,6), iVar4 == 0)) {
      bVar2 = pbVar10[7];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_00393187;
      this->filePtr = (char *)(pbVar10 + (8 - (ulong)(bVar2 == 0)));
      bVar3 = ParseString(this,out,"*BITMAP");
      if (!bVar3) {
        SkipToNextToken(this);
      }
      iVar4 = std::__cxx11::string::compare((char *)out);
      bVar3 = true;
      if (iVar4 == 0) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"ASE: Skipping invalid map entry");
        std::__cxx11::string::_M_replace
                  ((ulong)out,0,(char *)(local_1f8->mMapName)._M_string_length,0x6a8b41);
      }
    }
    else {
LAB_00393187:
      iVar4 = strncmp("UVW_U_OFFSET",(char *)pbVar8,0xc);
      if (iVar4 != 0) {
LAB_003931a3:
        iVar4 = strncmp("UVW_V_OFFSET",(char *)pbVar8,0xc);
        if (iVar4 == 0) {
          bVar2 = pbVar10[0xd];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pbVar8 = pbVar10 + 0xd;
            lVar9 = 0xe;
            fOut = local_1d8;
            goto LAB_00393445;
          }
        }
        iVar4 = strncmp("UVW_U_TILING",(char *)pbVar8,0xc);
        if (iVar4 == 0) {
          bVar2 = pbVar10[0xd];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pbVar8 = pbVar10 + 0xd;
            lVar9 = 0xe;
            fOut = local_1e0;
            goto LAB_00393445;
          }
        }
        iVar4 = strncmp("UVW_V_TILING",(char *)pbVar8,0xc);
        if (iVar4 == 0) {
          bVar2 = pbVar10[0xd];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pbVar8 = pbVar10 + 0xd;
            lVar9 = 0xe;
            fOut = local_1e8;
            goto LAB_00393445;
          }
        }
        iVar4 = strncmp("UVW_ANGLE",(char *)pbVar8,9);
        if (iVar4 == 0) {
          bVar2 = pbVar10[10];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pbVar8 = pbVar10 + 10;
            lVar9 = 0xb;
            fOut = local_1f0;
            goto LAB_00393445;
          }
        }
        iVar4 = strncmp("MAP_AMOUNT",(char *)pbVar8,10);
        if (iVar4 == 0) {
          bVar2 = pbVar10[0xb];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pbVar8 = pbVar10 + 0xb;
            lVar9 = 0xc;
            fOut = local_1f8;
            goto LAB_00393445;
          }
        }
        bVar2 = *pbVar8;
        pbVar10 = pbVar8;
        goto LAB_00393461;
      }
      bVar2 = pbVar10[0xd];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_003931a3;
      pbVar8 = pbVar10 + 0xd;
      lVar9 = 0xe;
      fOut = local_1d0;
LAB_00393445:
      pbVar10 = pbVar10 + lVar9;
      if (bVar2 == 0) {
        pbVar10 = pbVar8;
      }
      this->filePtr = (char *)pbVar10;
      ParseLV4MeshFloat(this,&fOut->mTextureBlend);
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MapBlock(Texture& map)
{
    AI_ASE_PARSER_INIT();

    // ***********************************************************
    // *BITMAP should not be there if *MAP_CLASS is not BITMAP,
    // but we need to expect that case ... if the path is
    // empty the texture won't be used later.
    // ***********************************************************
    bool parsePath = true;
    std::string temp;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // type of map
            if (TokenMatch(filePtr,"MAP_CLASS" ,9))
            {
                temp.clear();
                if(!ParseString(temp,"*MAP_CLASS"))
                    SkipToNextToken();
                if (temp != "Bitmap" && temp != "Normal Bump")
                {
                    ASSIMP_LOG_WARN_F("ASE: Skipping unknown map type: ", temp);
                    parsePath = false;
                }
                continue;
            }
            // path to the texture
            if (parsePath && TokenMatch(filePtr,"BITMAP" ,6))
            {
                if(!ParseString(map.mMapName,"*BITMAP"))
                    SkipToNextToken();

                if (map.mMapName == "None")
                {
                    // Files with 'None' as map name are produced by
                    // an Maja to ASE exporter which name I forgot ..
                    ASSIMP_LOG_WARN("ASE: Skipping invalid map entry");
                    map.mMapName = "";
                }

                continue;
            }
            // offset on the u axis
            if (TokenMatch(filePtr,"UVW_U_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetU);
                continue;
            }
            // offset on the v axis
            if (TokenMatch(filePtr,"UVW_V_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetV);
                continue;
            }
            // tiling on the u axis
            if (TokenMatch(filePtr,"UVW_U_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleU);
                continue;
            }
            // tiling on the v axis
            if (TokenMatch(filePtr,"UVW_V_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleV);
                continue;
            }
            // rotation around the z-axis
            if (TokenMatch(filePtr,"UVW_ANGLE" ,9))
            {
                ParseLV4MeshFloat(map.mRotation);
                continue;
            }
            // map blending factor
            if (TokenMatch(filePtr,"MAP_AMOUNT" ,10))
            {
                ParseLV4MeshFloat(map.mTextureBlend);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MAP_XXXXXX");
    }
    return;
}